

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::toString<double>(String *__return_storage_ptr__,doctest *this,IsNaN<double> in)

{
  char *in_00;
  String local_c0;
  String local_a8;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  double local_20;
  IsNaN<double> in_local;
  
  local_20 = in.value;
  in_local.value._0_1_ = SUB81(this,0);
  in_00 = "";
  if (((ulong)this & 1) != 0) {
    in_00 = "! ";
  }
  in_local._8_8_ = __return_storage_ptr__;
  String::String(&local_68,in_00);
  String::String(&local_80,"IsNaN( ");
  operator+(&local_50,&local_68,&local_80);
  toString(&local_a8,local_20);
  operator+(&local_38,&local_50,&local_a8);
  String::String(&local_c0," )");
  operator+(__return_storage_ptr__,&local_38,&local_c0);
  String::~String(&local_c0);
  String::~String(&local_38);
  String::~String(&local_a8);
  String::~String(&local_50);
  String::~String(&local_80);
  String::~String(&local_68);
  return __return_storage_ptr__;
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }